

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

void do_predtest1(TCGContext_conflict1 *tcg_ctx,TCGv_i64 d,TCGv_i64 g)

{
  TCGv_i32 retval;
  TCGv_i32 t;
  TCGv_i64 g_local;
  TCGv_i64 d_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  retval = tcg_temp_new_i32(tcg_ctx);
  gen_helper_sve_predtest1(tcg_ctx,retval,d,g);
  do_pred_flags(tcg_ctx,retval);
  tcg_temp_free_i32(tcg_ctx,retval);
  return;
}

Assistant:

static void do_predtest1(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 g)
{
    TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);

    gen_helper_sve_predtest1(tcg_ctx, t, d, g);
    do_pred_flags(tcg_ctx, t);
    tcg_temp_free_i32(tcg_ctx, t);
}